

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

void mcu8str_append_cstr(mcu8str *str,char *c_str)

{
  mcu8str_size_t __n;
  ulong uVar1;
  mcu8str_size_t nsize;
  
  __n = mctools_strlen(c_str,0);
  if (__n != 0) {
    uVar1 = (ulong)str->size;
    nsize = __n + uVar1;
    if ((ulong)str->buflen < __n + uVar1 + 1) {
      mcu8str_reserve(str,nsize);
      uVar1 = (ulong)str->size;
    }
    memcpy(str->c_str + uVar1,c_str,__n);
    str->c_str[nsize] = '\0';
    str->size = (uint)nsize;
  }
  return;
}

Assistant:

void mcu8str_append_cstr( mcu8str* str, const char * c_str )
  {
    const mcu8str_size_t o_size = mctools_strlen( c_str, 0 );
    if ( o_size == 0 )
      return;
    const mcu8str_size_t newsize = str->size + o_size;
    if ( newsize + 1 > str->buflen )
      mcu8str_reserve( str, newsize );
    //memcpy ok since we handle the null char afterwards, there will be no
    //overlapping even if c_str = str.c_str:
    STDNS memcpy( str->c_str + str->size, c_str, o_size );
    str->c_str[newsize] = '\0';
    str->size = (unsigned)newsize;//cast ok, mcu8str_reserve checked.
  }